

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_list_view_end(nk_list_view *view)

{
  long lVar1;
  long in_RDI;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x10) != 0)) {
    lVar1 = *(long *)(*(long *)(*(long *)(in_RDI + 0x10) + 0x40d8) + 0xa8);
    *(float *)(lVar1 + 0x2c) = *(float *)(lVar1 + 0xc) + (float)*(int *)(in_RDI + 0xc);
    **(int **)(in_RDI + 0x18) = **(int **)(in_RDI + 0x18) + *(int *)(in_RDI + 0x20);
    nk_group_end((nk_context *)0x13517d);
  }
  return;
}

Assistant:

NK_API void
nk_list_view_end(struct nk_list_view *view)
{
struct nk_context *ctx;
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(view);
NK_ASSERT(view->ctx);
NK_ASSERT(view->scroll_pointer);
if (!view || !view->ctx) return;

ctx = view->ctx;
win = ctx->current;
layout = win->layout;
layout->at_y = layout->bounds.y + (float)view->total_height;
*view->scroll_pointer = *view->scroll_pointer + view->scroll_value;
nk_group_end(view->ctx);
}